

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

int ParseLocalArrayChunk(void *chunk,ACSLocalArrays *arrays,int offset)

{
  ushort uVar1;
  uint uVar2;
  ACSLocalArrayInfo *pAVar3;
  uint i;
  ulong uVar4;
  ulong uVar5;
  
  uVar1 = *(ushort *)((long)chunk + 4);
  uVar5 = (long)(int)(uVar1 - 2) / 4;
  arrays->Count = (uint)uVar5;
  if (5 < uVar1) {
    uVar5 = uVar5 & 0xffffffff;
    pAVar3 = (ACSLocalArrayInfo *)operator_new__(uVar5 * 8);
    arrays->Info = pAVar3;
    for (uVar4 = 0; uVar5 != uVar4; uVar4 = uVar4 + 1) {
      uVar2 = *(uint *)((long)chunk + uVar4 * 4 + 10);
      pAVar3[uVar4].Size = uVar2;
      pAVar3[uVar4].Offset = offset;
      offset = offset + uVar2;
    }
  }
  return offset;
}

Assistant:

static int ParseLocalArrayChunk(void *chunk, ACSLocalArrays *arrays, int offset)
{
	unsigned count = (LittleShort(static_cast<unsigned short>(((unsigned *)chunk)[1]) - 2)) / 4;
	int *sizes = (int *)((BYTE *)chunk + 10);
	arrays->Count = count;
	if (count > 0)
	{
		ACSLocalArrayInfo *info = new ACSLocalArrayInfo[count];
		arrays->Info = info;
		for (unsigned i = 0; i < count; ++i)
		{
			info[i].Size = LittleLong(sizes[i]);
			info[i].Offset = offset;
			offset += info[i].Size;
		}
	}
	// Return the new local variable size, with space for the arrays
	return offset;
}